

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
adios2sys::CommandLineArguments::DeleteRemainingArguments
          (CommandLineArguments *this,int argc,char ***argv)

{
  ulong uVar1;
  
  if (0 < argc) {
    uVar1 = 0;
    do {
      if ((*argv)[uVar1] != (char *)0x0) {
        operator_delete__((*argv)[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  if (*argv != (char **)0x0) {
    operator_delete__(*argv);
    return;
  }
  return;
}

Assistant:

void CommandLineArguments::DeleteRemainingArguments(int argc, char*** argv)
{
  int cc;
  for (cc = 0; cc < argc; ++cc) {
    delete[] (*argv)[cc];
  }
  delete[] * argv;
}